

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifgtw(bifcxdef *ctx,int argc)

{
  objnum objn;
  ushort prp;
  runcxdef *prVar1;
  voccxdef *ctx_00;
  runsdef *prVar2;
  uint16_t tmp;
  int siz;
  int cnt;
  bifgtw_cb_ctx fnctx;
  runsdef val;
  uint local_58;
  int local_54;
  uchar *local_50;
  uint local_48;
  runsdef local_40;
  
  prVar1 = ctx->bifcxrun;
  ctx_00 = prVar1->runcxvoc;
  prVar2 = prVar1->runcxsp;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x02') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar2 = prVar1->runcxsp;
  objn = (prVar2->runsv).runsvobj;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\r') {
    prp = (prVar1->runcxsp->runsv).runsvprp;
    if ((ushort)(prp - 2) < 6) {
      voc_count(ctx_00,objn,prp,&local_54,(int *)&local_58);
      local_58 = local_58 + local_54 * 4 + 2;
      prVar1 = ctx->bifcxrun;
      if ((uint)(*(int *)&prVar1->runcxhtop - *(int *)&prVar1->runcxhp) <= local_58) {
        runhcmp(prVar1,local_58,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
      }
      local_50 = ctx->bifcxrun->runcxhp + 2;
      local_48 = (uint)prp;
      voc_iterate(ctx_00,objn,bifgtw_cb,&local_50);
      local_40.runstyp = '\a';
      local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
      *(objnum *)local_40.runsv.runsvstr = (short)local_50 - local_40.runsv.runsvobj;
      ctx->bifcxrun->runcxhp = local_50;
      runrepush(ctx->bifcxrun,&local_40);
      return;
    }
    prVar1->runcxerr->errcxptr->erraav[0].errastr = "delword";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  prVar1->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f4);
}

Assistant:

void bifgtw(bifcxdef *ctx, int argc)
{
    objnum    objn;
    prpnum    prpn;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    int       cnt;
    int       siz;
    runsdef   val;
    struct bifgtw_cb_ctx fnctx;

    bifcntargs(ctx, 2, argc);

    /* get the arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    
    /* make sure the property is a valid part of speech property */
    if (!prpisvoc(prpn))
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "delword");

    /* get the size of the list we'll need to build */
    voc_count(voc, objn, prpn, &cnt, &siz);

    /*
     *   calculate how much space it will take to make a list out of all
     *   these words: 2 bytes for the list length header; plus, for each
     *   entry, 1 byte for the type header, 2 bytes for the string size
     *   header, and possibly one extra byte for the two-word separator --
     *   a total of 4 bytes extra per word.  
     */
    siz += 2 + 4*cnt;

    /* reserve the space */
    runhres(ctx->bifcxrun, siz, 0);

    /* set up our callback context, and build the list */
    fnctx.p = ctx->bifcxrun->runcxhp + 2;
    fnctx.typ = prpn;
    voc_iterate(voc, objn, bifgtw_cb, &fnctx);

    /* set up the return value */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* write the list length, and advance past the space we used */
    oswp2(ctx->bifcxrun->runcxhp, fnctx.p - ctx->bifcxrun->runcxhp);
    ctx->bifcxrun->runcxhp = fnctx.p;

    /* return the list */
    runrepush(ctx->bifcxrun, &val);
}